

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_erl_generator.cc
# Opt level: O0

void __thiscall t_erl_generator::init_generator(t_erl_generator *this)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  ostream *poVar4;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  int __oflag_02;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [8];
  string f_consts_hrl_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  string f_consts_name;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string f_types_hrl_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string f_types_name;
  undefined1 local_c8 [8];
  string program_module_name;
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_erl_generator *ptStack_10;
  int r;
  t_erl_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = mkdir(pcVar2,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar1;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      program_module_name.field_2._M_local_buf[10] = '\x01';
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_98);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,pcVar2,
                 (allocator *)(program_module_name.field_2._M_local_buf + 0xb));
      std::operator+(&local_58,&local_78,": ");
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::operator+(__return_storage_ptr__,&local_58,pcVar2);
      program_module_name.field_2._M_local_buf[10] = '\0';
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  this->export_lines_first_ = true;
  this->export_types_lines_first_ = true;
  std::__cxx11::string::string
            ((string *)(f_types_name.field_2._M_local_buf + 8),
             (string *)&(this->super_t_generator).program_name_);
  make_safe_for_module_name
            ((string *)local_c8,this,(string *)(f_types_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(f_types_name.field_2._M_local_buf + 8));
  (*(this->super_t_generator)._vptr_t_generator[0x1b])
            ((undefined1 *)((long)&f_types_hrl_name.field_2 + 8));
  std::operator+(&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_types_hrl_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 &local_128,"_types.erl");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)(f_types_hrl_name.field_2._M_local_buf + 8));
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_1a8);
  std::operator+(&local_188,&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 &local_188,"_types.hrl");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,pcVar2,&local_1c9);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_types_file_,(char *)local_1c8,__oflag);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,pcVar2,&local_1f1);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_types_hrl_file_,(char *)local_1f0,__oflag_00);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::operator+(&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 "_types");
  hrl_header(this,(ostream *)&this->f_types_hrl_file_,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  erl_autogen_comment_abi_cxx11_(&local_238,this);
  poVar4 = std::operator<<((ostream *)&this->f_types_file_,(string *)&local_238);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"-module(");
  poVar4 = std::operator<<(poVar4,(string *)local_c8);
  poVar4 = std::operator<<(poVar4,"_types).");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  erl_imports_abi_cxx11_(&local_258,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_258);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  poVar4 = std::operator<<((ostream *)&this->f_types_file_,"-include(\"");
  poVar4 = std::operator<<(poVar4,(string *)local_c8);
  poVar4 = std::operator<<(poVar4,"_types.hrl\").");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  render_includes_abi_cxx11_((string *)((long)&f_consts_name.field_2 + 8),this);
  poVar4 = std::operator<<((ostream *)&this->f_types_hrl_file_,
                           (string *)(f_consts_name.field_2._M_local_buf + 8));
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(f_consts_name.field_2._M_local_buf + 8));
  (*(this->super_t_generator)._vptr_t_generator[0x1b])
            ((undefined1 *)((long)&f_consts_hrl_name.field_2 + 8));
  std::operator+(&local_2b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_consts_hrl_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                 &local_2b8,"_constants.erl");
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)(f_consts_hrl_name.field_2._M_local_buf + 8));
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_338);
  std::operator+(&local_318,&local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                 &local_318,"_constants.hrl");
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,pcVar2,&local_359);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_consts_file_,(char *)local_358,__oflag_01);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,pcVar2,&local_381);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_consts_hrl_file_,(char *)local_380,__oflag_02);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  erl_autogen_comment_abi_cxx11_(&local_3a8,this);
  poVar4 = std::operator<<((ostream *)&this->f_consts_file_,(string *)&local_3a8);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"-module(");
  poVar4 = std::operator<<(poVar4,(string *)local_c8);
  poVar4 = std::operator<<(poVar4,"_constants).");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  erl_imports_abi_cxx11_(&local_3c8,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_3c8);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"-include(\"");
  poVar4 = std::operator<<(poVar4,(string *)local_c8);
  poVar4 = std::operator<<(poVar4,"_types.hrl\").");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  erl_autogen_comment_abi_cxx11_(&local_3e8,this);
  poVar4 = std::operator<<((ostream *)&this->f_consts_hrl_file_,(string *)&local_3e8);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  erl_imports_abi_cxx11_(&local_408,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_408);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"-include(\"");
  poVar4 = std::operator<<(poVar4,(string *)local_c8);
  poVar4 = std::operator<<(poVar4,"_types.hrl\").");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void t_erl_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  // setup export lines
  export_lines_first_ = true;
  export_types_lines_first_ = true;

  string program_module_name = make_safe_for_module_name(program_name_);

  // types files
  string f_types_name = get_out_dir() + program_module_name + "_types.erl";
  string f_types_hrl_name = get_out_dir() + program_module_name + "_types.hrl";

  f_types_file_.open(f_types_name.c_str());
  f_types_hrl_file_.open(f_types_hrl_name.c_str());

  hrl_header(f_types_hrl_file_, program_module_name + "_types");

  f_types_file_ << erl_autogen_comment() << endl
                << "-module(" << program_module_name << "_types)." << endl
                << erl_imports() << endl;

  f_types_file_ << "-include(\"" << program_module_name << "_types.hrl\")." << endl
                  << endl;

  f_types_hrl_file_ << render_includes() << endl;

  // consts files
  string f_consts_name = get_out_dir() + program_module_name + "_constants.erl";
  string f_consts_hrl_name = get_out_dir() + program_module_name + "_constants.hrl";

  f_consts_file_.open(f_consts_name.c_str());
  f_consts_hrl_file_.open(f_consts_hrl_name.c_str());

  f_consts_file_ << erl_autogen_comment() << endl
                 << "-module(" << program_module_name << "_constants)." << endl
                 << erl_imports() << endl
                 << "-include(\"" << program_module_name << "_types.hrl\")." << endl
                 << endl;

  f_consts_hrl_file_ << erl_autogen_comment() << endl << erl_imports() << endl
                     << "-include(\"" << program_module_name << "_types.hrl\")." << endl << endl;
}